

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

bool QtPrivate::QLessThanOperatorForType<QList<short>,_true>::lessThan
               (QMetaTypeInterface *param_1,void *a,void *b)

{
  short *psVar1;
  ulong uVar2;
  ulong uVar3;
  short *psVar4;
  short *psVar5;
  short *psVar6;
  
  psVar1 = *(short **)((long)b + 8);
  uVar2 = *(ulong *)((long)b + 0x10);
  uVar3 = *(ulong *)((long)a + 0x10);
  if ((long)uVar2 < (long)*(ulong *)((long)a + 0x10)) {
    uVar3 = uVar2;
  }
  psVar4 = psVar1;
  if ((uVar3 & 0x7fffffffffffffff) != 0) {
    psVar5 = *(short **)((long)a + 8);
    psVar6 = psVar5 + uVar3;
    do {
      if (*psVar4 != *psVar5) {
        return *psVar5 < *psVar4;
      }
      psVar5 = psVar5 + 1;
      psVar4 = psVar4 + 1;
    } while (psVar5 != psVar6);
  }
  return psVar4 != psVar1 + uVar2;
}

Assistant:

const T *constEnd() const noexcept { return data() + size; }